

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O1

void __thiscall Imf_3_2::Image::clearChannels(Image *this)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (0 < (this->_levels)._sizeX) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar2 = (this->_levels)._sizeY;
      if (0 < lVar2) {
        lVar3 = 0;
        do {
          plVar1 = *(long **)((long)(this->_levels)._data + lVar3 * 8 + lVar2 * lVar4);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 0x30))();
          }
          lVar3 = lVar3 + 1;
          lVar2 = (this->_levels)._sizeY;
        } while (lVar3 < lVar2);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 8;
    } while (lVar5 < (this->_levels)._sizeX);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
  ::clear(&(this->_channels)._M_t);
  return;
}

Assistant:

void
Image::clearChannels ()
{
    for (int y = 0; y < _levels.height (); ++y)
        for (int x = 0; x < _levels.width (); ++x)
            if (_levels[y][x]) _levels[y][x]->clearChannels ();

    _channels.clear ();
}